

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::StringMakerBase<true>::
convert<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)1>>>
          (String *__return_storage_ptr__,StringMakerBase<true> *this,
          shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x01_>_> *in)

{
  ostream *__os;
  
  __os = tlssPush();
  std::operator<<(__os,(__shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x01_>,_(__gnu_cxx::_Lock_policy)2>
                        *)this);
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
                /* When parameter "in" is a null terminated const char* it works.
                 * When parameter "in" is a T arr[N] without '\0' we can fill the
                 * stringstream with N objects (T=char).If in is char pointer *
                 * without '\0' , it would cause segfault
                 * stepping over unaccessible memory.
                 */

                std::ostream* stream = tlssPush();
                filloss(stream, in);
                return tlssPop();
            }